

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_huffman_codes.cpp
# Opt level: O1

bool lzham::generate_huffman_codes
               (void *pContext,uint num_syms,uint16 *pFreq,uint8 *pCodesizes,uint *max_code_size,
               uint *total_freq_ret)

{
  int iVar1;
  int *piVar2;
  ushort uVar3;
  uint uVar4;
  ulong uVar5;
  uint *puVar6;
  uint *puVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  int iVar14;
  uint *puVar15;
  int iVar16;
  long lVar17;
  uint uVar18;
  ulong uVar19;
  bool bVar20;
  int x [600];
  undefined8 local_da0;
  uint local_d98 [256];
  uint local_998 [344];
  uint auStack_438 [258];
  
  if (num_syms - 1 < 600) {
    if (num_syms == 0) {
      uVar19 = 0;
      uVar8 = 0;
    }
    else {
      uVar12 = 0;
      uVar8 = 0;
      uVar19 = 0;
      do {
        uVar3 = pFreq[uVar12];
        if (uVar3 == 0) {
          pCodesizes[uVar12] = '\0';
        }
        else {
          uVar8 = uVar8 + uVar3;
          *(short *)((long)pContext + uVar19 * 8 + 4) = (short)uVar12;
          *(undefined2 *)((long)pContext + uVar19 * 8 + 6) = 0xffff;
          *(uint *)((long)pContext + uVar19 * 8) = (uint)uVar3;
          uVar19 = (ulong)((int)uVar19 + 1);
        }
        uVar12 = uVar12 + 1;
      } while (num_syms != uVar12);
    }
    *total_freq_ret = uVar8;
    uVar18 = (uint)uVar19;
    if (uVar18 == 1) {
      pCodesizes[*(ushort *)((long)pContext + 4)] = '\x01';
    }
    else {
      local_da0 = max_code_size;
      memset(local_d98,0,0x800);
      puVar7 = (uint *)pContext;
      if ((uVar19 & 0xfffffffe) != 0) {
        do {
          uVar10 = *puVar7;
          uVar11 = puVar7[2];
          local_d98[uVar10 & 0xff] = local_d98[uVar10 & 0xff] + 1;
          piVar2 = (int *)((long)local_998 + (ulong)(uVar10 >> 6 & 0x3fc));
          *piVar2 = *piVar2 + 1;
          local_d98[uVar11 & 0xff] = local_d98[uVar11 & 0xff] + 1;
          piVar2 = (int *)((long)local_998 + (ulong)(uVar11 >> 6 & 0x3fc));
          *piVar2 = *piVar2 + 1;
          puVar7 = puVar7 + 4;
        } while (puVar7 != (uint *)((long)pContext + (ulong)(uVar18 & 0xfffffffe) * 8));
      }
      if ((uVar19 & 1) != 0) {
        uVar10 = *puVar7;
        local_d98[uVar10 & 0xff] = local_d98[uVar10 & 0xff] + 1;
        piVar2 = (int *)((long)local_998 + (ulong)(uVar10 >> 6 & 0x3fc));
        *piVar2 = *piVar2 + 1;
      }
      puVar7 = local_d98 + 1;
      puVar6 = (uint *)((long)pContext + 0x2588);
      lVar17 = 0;
      do {
        puVar15 = puVar6;
        uVar12 = 0xfffffffffffffffe;
        uVar10 = 0;
        do {
          auStack_438[uVar12 + 2] = uVar10;
          uVar11 = puVar7[uVar12 + 1];
          auStack_438[uVar12 + 3] = uVar10 + uVar11;
          uVar10 = uVar10 + uVar11 + puVar7[uVar12 + 2];
          uVar12 = uVar12 + 2;
          uVar9 = (ulong)(uVar18 & 0xfffffffe) << 3;
          puVar6 = (uint *)pContext;
          uVar5 = uVar19 & 0xfffffffe;
        } while (uVar12 < 0xfe);
        while (uVar5 != 0) {
          uVar10 = puVar6[2] >> 8;
          uVar11 = *puVar6 >> 8;
          if (lVar17 == 0) {
            uVar10 = puVar6[2];
            uVar11 = *puVar6;
          }
          uVar11 = uVar11 & 0xff;
          uVar10 = uVar10 & 0xff;
          uVar4 = auStack_438[uVar11];
          if (uVar11 == uVar10) {
            auStack_438[uVar11] = uVar4 + 2;
            *(undefined8 *)(puVar15 + (ulong)uVar4 * 2) = *(undefined8 *)puVar6;
            uVar11 = uVar4 + 1;
          }
          else {
            auStack_438[uVar11] = uVar4 + 1;
            uVar11 = auStack_438[uVar10];
            auStack_438[uVar10] = uVar11 + 1;
            *(undefined8 *)(puVar15 + (ulong)uVar4 * 2) = *(undefined8 *)puVar6;
          }
          *(undefined8 *)(puVar15 + (ulong)uVar11 * 2) = *(undefined8 *)(puVar6 + 2);
          uVar9 = uVar9 - 0x10;
          puVar6 = puVar6 + 4;
          uVar5 = uVar9;
        }
        if ((uVar19 & 1) != 0) {
          uVar11 = *puVar6 >> ((char)lVar17 * '\b' & 0x1fU) & 0xff;
          uVar10 = auStack_438[uVar11];
          auStack_438[uVar11] = uVar10 + 1;
          *(undefined8 *)(puVar15 + (ulong)uVar10 * 2) = *(undefined8 *)puVar6;
        }
        if (local_998[0] == uVar18) break;
        puVar7 = puVar7 + 0x100;
        bVar20 = lVar17 == 0;
        puVar6 = (uint *)pContext;
        lVar17 = lVar17 + 1;
        pContext = puVar15;
      } while (bVar20);
      if (uVar18 == 0) {
        uVar18 = 0;
      }
      else {
        uVar12 = 0;
        do {
          local_d98[uVar12] = puVar15[uVar12 * 2];
          uVar12 = uVar12 + 1;
        } while (uVar19 != uVar12);
        local_d98[0] = local_d98[0] + local_d98[1];
        uVar10 = uVar18 - 1;
        if (2 < (int)uVar18) {
          iVar16 = 0;
          iVar14 = 2;
          uVar12 = 1;
          do {
            if ((iVar14 < (int)uVar18) &&
               (lVar17 = (long)iVar14, (int)local_d98[lVar17] <= (int)local_d98[iVar16])) {
              iVar14 = iVar14 + 1;
              local_d98[uVar12] = local_d98[lVar17];
            }
            else {
              local_d98[uVar12] = local_d98[iVar16];
              local_d98[iVar16] = (uint)uVar12;
              iVar16 = iVar16 + 1;
            }
            lVar17 = (long)iVar16;
            if ((iVar14 < (int)uVar18) &&
               (((long)uVar12 <= lVar17 || ((int)local_d98[iVar14] <= (int)local_d98[lVar17])))) {
              local_d98[uVar12] = local_d98[uVar12] + local_d98[iVar14];
              iVar14 = iVar14 + 1;
            }
            else {
              local_d98[uVar12] = local_d98[uVar12] + local_d98[lVar17];
              iVar16 = iVar16 + 1;
              local_d98[lVar17] = (uint)uVar12;
            }
            uVar12 = uVar12 + 1;
          } while (uVar10 != uVar12);
        }
        *(undefined4 *)((long)&local_da0 + (long)(int)uVar18 * 4) = 0;
        if (2 < (int)uVar18) {
          lVar17 = (ulong)(uVar18 - 3) + 1;
          do {
            *(uint *)((long)&local_da0 + lVar17 * 4 + 4) =
                 local_d98[*(int *)((long)&local_da0 + lVar17 * 4 + 4)] + 1;
            lVar13 = lVar17 + -1;
            bVar20 = 0 < lVar17;
            lVar17 = lVar13;
          } while (lVar13 != 0 && bVar20);
        }
        uVar18 = uVar18 - 2;
        iVar14 = 1;
        uVar11 = 0;
        do {
          if ((int)uVar18 < 0) {
            iVar16 = 0;
          }
          else {
            iVar1 = uVar18 + 1;
            iVar16 = 0;
            do {
              if (local_d98[uVar18] != uVar11) goto LAB_0012036b;
              iVar16 = iVar16 + 1;
              uVar18 = uVar18 - 1;
            } while (iVar1 != iVar16);
            uVar18 = 0xffffffff;
            iVar16 = iVar1;
          }
LAB_0012036b:
          if (iVar16 < iVar14) {
            puVar7 = local_d98 + (int)uVar10;
            uVar10 = (uVar10 + iVar16) - iVar14;
            do {
              *puVar7 = uVar11;
              iVar14 = iVar14 + -1;
              puVar7 = puVar7 + -1;
            } while (iVar16 < iVar14);
          }
          iVar14 = iVar16 * 2;
          uVar11 = uVar11 + 1;
        } while (iVar16 != 0);
        uVar12 = 0;
        uVar18 = 0;
        do {
          uVar10 = local_d98[uVar12];
          if (uVar18 < uVar10) {
            uVar18 = uVar10;
          }
          pCodesizes[(ushort)puVar15[uVar12 * 2 + 1]] = (uint8)uVar10;
          uVar12 = uVar12 + 1;
        } while (uVar19 != uVar12);
      }
      *local_da0 = uVar18;
    }
  }
  return num_syms - 1 < 600;
}

Assistant:

bool generate_huffman_codes(void* pContext, uint num_syms, const uint16* pFreq, uint8* pCodesizes, uint& max_code_size, uint& total_freq_ret)
   {
      if ((!num_syms) || (num_syms > cHuffmanMaxSupportedSyms))
         return false;
                  
      huffman_work_tables& state = *static_cast<huffman_work_tables*>(pContext);;
            
      uint max_freq = 0;
      uint total_freq = 0;
      
      uint num_used_syms = 0;
      for (uint i = 0; i < num_syms; i++)
      {
         uint freq = pFreq[i];
         
         if (!freq)
            pCodesizes[i] = 0;
         else
         {
            total_freq += freq;
            max_freq = math::maximum(max_freq, freq);
            
            sym_freq& sf = state.syms0[num_used_syms];
            sf.m_left = (uint16)i;
            sf.m_right = UINT16_MAX;
            sf.m_freq = freq;
            num_used_syms++;
         }            
      }
      
      total_freq_ret = total_freq;

      if (num_used_syms == 1)
      {
         pCodesizes[state.syms0[0].m_left] = 1;
         return true;
      }

      sym_freq* syms = radix_sort_syms(num_used_syms, state.syms0, state.syms1);
      
#if USE_CALCULATE_MINIMUM_REDUNDANCY
      int x[cHuffmanMaxSupportedSyms];
      for (uint i = 0; i < num_used_syms; i++)
         x[i] = syms[i].m_freq;
      
      calculate_minimum_redundancy(x, num_used_syms);
      
      uint max_len = 0;
      for (uint i = 0; i < num_used_syms; i++)
      {
         uint len = x[i];
         max_len = math::maximum(len, max_len);
         pCodesizes[syms[i].m_left] = static_cast<uint8>(len);
      }
      max_code_size = max_len;
#else    
      // Computes Huffman codelengths in linear time. More readable than calculate_minimum_redundancy(), and approximately the same speed, but not in-place.
      
      // Dummy node
      sym_freq& sf = state.syms0[num_used_syms];
      sf.m_left = UINT16_MAX;
      sf.m_right = UINT16_MAX;
      sf.m_freq = UINT_MAX;
      
      uint next_internal_node = num_used_syms + 1;
            
      uint queue_front = 0;
      uint queue_end = 0;
            
      uint next_lowest_sym = 0;
      
      uint num_nodes_remaining = num_used_syms;
      do
      {
         uint left_freq = syms[next_lowest_sym].m_freq;
         uint left_child = next_lowest_sym;
         
         if ((queue_end > queue_front) && (syms[state.queue[queue_front]].m_freq < left_freq))
         {
            left_child = state.queue[queue_front];
            left_freq = syms[left_child].m_freq;
            
            queue_front++;
         }
         else
            next_lowest_sym++;
         
         uint right_freq = syms[next_lowest_sym].m_freq;
         uint right_child = next_lowest_sym;

         if ((queue_end > queue_front) && (syms[state.queue[queue_front]].m_freq < right_freq))
         {
            right_child = state.queue[queue_front];
            right_freq = syms[right_child].m_freq;
            
            queue_front++;
         }
         else
            next_lowest_sym++;
      
         LZHAM_ASSERT(next_internal_node < huffman_work_tables::cMaxInternalNodes);
         
         const uint internal_node_index = next_internal_node;
         next_internal_node++;
         
         syms[internal_node_index].m_freq = left_freq + right_freq;
         syms[internal_node_index].m_left = static_cast<uint16>(left_child);
         syms[internal_node_index].m_right = static_cast<uint16>(right_child);
         
         LZHAM_ASSERT(queue_end < huffman_work_tables::cMaxInternalNodes);
         state.queue[queue_end] = static_cast<uint16>(internal_node_index);
         queue_end++;
                  
         num_nodes_remaining--;
         
      } while (num_nodes_remaining > 1);
      
      LZHAM_ASSERT(next_lowest_sym == num_used_syms);
      LZHAM_ASSERT((queue_end - queue_front) == 1);
      
      uint cur_node_index = state.queue[queue_front];
      
      uint32* pStack = (syms == state.syms0) ? (uint32*)state.syms1 : (uint32*)state.syms0;
      uint32* pStack_top = pStack;

      uint max_level = 0;
      
      for ( ; ; ) 
      {
         uint level = cur_node_index >> 16;
         uint node_index = cur_node_index & 0xFFFF;
         
         uint left_child = syms[node_index].m_left;
         uint right_child = syms[node_index].m_right;
         
         uint next_level = (cur_node_index + 0x10000) & 0xFFFF0000;
                           
         if (left_child < num_used_syms)
         {
            max_level = math::maximum(max_level, level);
            
            pCodesizes[syms[left_child].m_left] = static_cast<uint8>(level + 1);
            
            if (right_child < num_used_syms)
            {
               pCodesizes[syms[right_child].m_left] = static_cast<uint8>(level + 1);
               
               if (pStack == pStack_top) break;
               cur_node_index = *--pStack;
            }
            else
            {
               cur_node_index = next_level | right_child;
            }
         }
         else
         {
            if (right_child < num_used_syms)
            {
               max_level = math::maximum(max_level, level);
               
               pCodesizes[syms[right_child].m_left] = static_cast<uint8>(level + 1);
                              
               cur_node_index = next_level | left_child;
            }
            else
            {
               *pStack++ = next_level | left_child;
                              
               cur_node_index = next_level | right_child;
            }
         }
      }
      
      max_code_size = max_level + 1;
#endif
                  
      return true;
   }